

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

int Gia_ManHashMuxReal(Gia_Man_t *p,int iLitC,int iLit1,int iLit0)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  uint uVar7;
  uint iLitC_00;
  
  if (p->fAddStrash != 0) {
    __assert_fail("p->fAddStrash == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                  ,0x20c,"int Gia_ManHashMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLitC < 2) {
    if (iLitC != 0) {
      iLit0 = iLit1;
    }
    return iLit0;
  }
  iVar4 = iLit1;
  if (iLit0 < 2) {
    uVar7 = iLitC;
    if (iLit0 == 0) goto LAB_0020a2b6;
    uVar7 = iLitC ^ 1;
  }
  else if (iLit1 < 2) {
    uVar7 = iLitC;
    iVar4 = iLit0;
    if (iLit1 == 0) {
      uVar7 = iLitC ^ 1;
      iLit1 = iLit0;
LAB_0020a2b6:
      iVar4 = Gia_ManHashAnd(p,uVar7,iLit1);
      return iVar4;
    }
  }
  else {
    if (iLit0 == iLit1) {
      return iLit0;
    }
    uVar7 = iLit0;
    if (iLitC == iLit0 || (iLit1 ^ iLitC) == 1) goto LAB_0020a2b6;
    if (iLitC != iLit1 && (iLit0 ^ iLitC) != 1) {
      if ((uint)(iLit0 ^ iLit1) < 2) {
        iVar4 = Gia_ManHashXorReal(p,iLitC,iLit0);
        return iVar4;
      }
      uVar7 = iLit1;
      if (iLit1 < iLit0) {
        uVar7 = iLit0;
      }
      bVar3 = iLit1 < iLit0;
      if (iLit0 < iLit1) {
        iLit1 = iLit0;
      }
      if ((int)uVar7 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      iVar4 = 0;
      if ((uVar7 & 1) != 0) {
        if (iLit1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        iLit1 = iLit1 ^ 1;
        uVar7 = uVar7 & 0x7ffffffe;
        iVar4 = 1;
      }
      iLitC_00 = (uint)bVar3 ^ iLitC;
      puVar6 = (uint *)Gia_ManHashFind(p,iLit1,uVar7,iLitC_00);
      uVar5 = *puVar6;
      if (uVar5 == 0) {
        p->nHashMiss = p->nHashMiss + 1;
        iVar1 = (p->vHash).nSize;
        iVar2 = (p->vHash).nCap;
        uVar5 = Gia_ManAppendMuxReal(p,iLitC_00,uVar7,iLit1);
        if ((iVar2 <= iVar1) &&
           (puVar6 = (uint *)Gia_ManHashFind(p,iLit1,uVar7,iLitC_00), *puVar6 != 0)) {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                        ,0x22e,"int Gia_ManHashMuxReal(Gia_Man_t *, int, int, int)");
        }
        if (-1 < (int)uVar5) {
          *puVar6 = uVar5 >> 1;
          return (uVar5 & 0xfffffffe) + iVar4;
        }
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      p->nHashHit = p->nHashHit + 1;
      if (-1 < (int)uVar5) {
        return iVar4 + uVar5 * 2;
      }
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
  }
  iVar4 = Gia_ManHashOr(p,uVar7,iVar4);
  return iVar4;
}

Assistant:

int Gia_ManHashMuxReal( Gia_Man_t * p, int iLitC, int iLit1, int iLit0 )  
{
    int fCompl = 0;
    assert( p->fAddStrash == 0 );
    if ( iLitC < 2 )
        return iLitC ? iLit1 : iLit0;
    if ( iLit0 < 2 )
        return iLit0 ? Gia_ManHashOr(p, Abc_LitNot(iLitC), iLit1) : Gia_ManHashAnd(p, iLitC, iLit1);
    if ( iLit1 < 2 )
        return iLit1 ? Gia_ManHashOr(p, iLitC, iLit0) : Gia_ManHashAnd(p, Abc_LitNot(iLitC), iLit0);
    assert( iLit0 > 1 && iLit1 > 1 && iLitC > 1 );
    if ( iLit0 == iLit1 )
        return iLit0;
    if ( iLitC == iLit0 || iLitC == Abc_LitNot(iLit1) )
        return Gia_ManHashAnd(p, iLit0, iLit1);
    if ( iLitC == iLit1 || iLitC == Abc_LitNot(iLit0) )
        return Gia_ManHashOr(p, iLit0, iLit1);
    if ( Abc_Lit2Var(iLit0) == Abc_Lit2Var(iLit1) )
        return Gia_ManHashXorReal( p, iLitC, iLit0 );
    if ( iLit0 > iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1, iLitC = Abc_LitNot(iLitC);
    if ( Abc_LitIsCompl(iLit1) )
        iLit0 = Abc_LitNot(iLit0), iLit1 = Abc_LitNot(iLit1), fCompl = 1;
    {
        int *pPlace = Gia_ManHashFind( p, iLit0, iLit1, iLitC );
        if ( *pPlace )
        {
            p->nHashHit++;
            return Abc_Var2Lit( *pPlace, fCompl );
        }
        p->nHashMiss++;
        if ( Vec_IntSize(&p->vHash) < Vec_IntCap(&p->vHash) )
            *pPlace = Abc_Lit2Var( Gia_ManAppendMuxReal( p, iLitC, iLit1, iLit0 ) );
        else
        {
            int iNode = Gia_ManAppendMuxReal( p, iLitC, iLit1, iLit0 );
            pPlace = Gia_ManHashFind( p, iLit0, iLit1, iLitC );
            assert( *pPlace == 0 );
            *pPlace = Abc_Lit2Var( iNode );
        }
        return Abc_Var2Lit( *pPlace, fCompl );
    }
}